

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O2

string_view helics::interfaceTypeName(InterfaceType type)

{
  char *pcVar1;
  undefined3 in_register_00000039;
  int iVar2;
  string_view sVar3;
  size_t sStack_8;
  
  iVar2 = CONCAT31(in_register_00000039,type);
  if (iVar2 == 0x74) {
    pcVar1 = "Translator";
    sStack_8 = 10;
  }
  else if (iVar2 == 0x66) {
    pcVar1 = "Filter";
    sStack_8 = 6;
  }
  else if (iVar2 == 0x69) {
    pcVar1 = "Input";
    sStack_8 = 5;
  }
  else if (iVar2 == 0x70) {
    pcVar1 = "Publication";
    sStack_8 = 0xb;
  }
  else if (iVar2 == 0x65) {
    pcVar1 = "Endpoint";
    sStack_8 = 8;
  }
  else {
    pcVar1 = "Interface";
    sStack_8 = 9;
  }
  sVar3._M_str = pcVar1;
  sVar3._M_len = sStack_8;
  return sVar3;
}

Assistant:

std::string_view interfaceTypeName(InterfaceType type) noexcept
{
    static constexpr std::string_view pubType{"Publication"};
    static constexpr std::string_view inpType{"Input"};
    static constexpr std::string_view endType{"Endpoint"};
    static constexpr std::string_view transType{"Translator"};
    static constexpr std::string_view filtType{"Filter"};
    static constexpr std::string_view otherType{"Interface"};

    switch (type) {
        case InterfaceType::PUBLICATION:
            return pubType;
        case InterfaceType::ENDPOINT:
            return endType;
        case InterfaceType::INPUT:
            return inpType;
        case InterfaceType::FILTER:
            return filtType;
        case InterfaceType::TRANSLATOR:
            return transType;
        default:
            return otherType;
    }
}